

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *enumNode)

{
  ListElementCount LVar1;
  bool *__s;
  ulong uVar2;
  ElementCount index;
  bool bVar3;
  ulong local_140;
  undefined8 *local_138;
  bool *local_130;
  Fault f;
  Array<bool> sawCodeOrder_heap;
  ArrayPtr<const_char> local_f8;
  ElementCount local_e8;
  undefined4 uStack_e4;
  int local_e0;
  anon_class_8_1_6f242a07 local_d0;
  Reader enumerant;
  anon_class_16_2_3f8e8a0c local_98;
  Reader enumerants;
  bool sawCodeOrder_stack [32];
  
  bVar3 = (enumNode->_reader).pointerCount < 4;
  enumerant._reader.data = (enumNode->_reader).pointers + 3;
  if (bVar3) {
    enumerant._reader.data = (WirePointer *)0x0;
  }
  enumerant._reader.pointers._0_4_ = (enumNode->_reader).nestingLimit;
  if (bVar3) {
    enumerant._reader.segment._0_4_ = 0;
    enumerant._reader.segment._4_4_ = 0;
    enumerant._reader.capTable._0_4_ = 0;
    enumerant._reader.capTable._4_4_ = 0;
    enumerant._reader.pointers._0_4_ = 0x7fffffff;
  }
  else {
    enumerant._reader.segment._0_4_ = *(undefined4 *)&(enumNode->_reader).segment;
    enumerant._reader.segment._4_4_ = *(undefined4 *)((long)&(enumNode->_reader).segment + 4);
    enumerant._reader.capTable._0_4_ = *(undefined4 *)&(enumNode->_reader).capTable;
    enumerant._reader.capTable._4_4_ = *(undefined4 *)((long)&(enumNode->_reader).capTable + 4);
  }
  _::PointerReader::getList
            (&enumerants.reader,(PointerReader *)&enumerant,INLINE_COMPOSITE,(word *)0x0);
  uVar2 = (ulong)enumerants.reader.elementCount;
  if (uVar2 < 0x21) {
    __s = sawCodeOrder_stack;
    local_138 = (undefined8 *)0x0;
    local_140 = 0;
    local_130 = (bool *)0x0;
  }
  else {
    __s = (bool *)kj::_::HeapArrayDisposer::allocateImpl
                            (1,uVar2,uVar2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_138 = &kj::_::HeapArrayDisposer::instance;
    local_140 = uVar2;
    local_130 = __s;
  }
  memset(__s,0,uVar2);
  LVar1 = enumerants.reader.elementCount;
  if (enumerants.reader.elementCount != 0) {
    index = 0;
    do {
      _::ListReader::getStructElement(&enumerant._reader,&enumerants.reader,index);
      local_e0 = enumerant._reader.nestingLimit;
      uStack_e4 = enumerant._reader.pointers._4_4_;
      local_e8 = (int)enumerant._reader.pointers;
      if (enumerant._reader.pointerCount == 0) {
        local_e8 = 0;
        uStack_e4 = 0;
        local_e0 = 0x7fffffff;
      }
      local_f8.ptr._0_4_ = 0;
      local_f8.ptr._4_4_ = 0;
      local_f8.size_._0_4_ = 0;
      local_f8.size_._4_4_ = 0;
      if (enumerant._reader.pointerCount != 0) {
        local_f8.ptr._0_4_ = enumerant._reader.segment._0_4_;
        local_f8.ptr._4_4_ = enumerant._reader.segment._4_4_;
        local_f8.size_._0_4_ = enumerant._reader.capTable._0_4_;
        local_f8.size_._4_4_ = enumerant._reader.capTable._4_4_;
      }
      _f = (ArrayPtr<const_char>)
           _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_f8,(void *)0x0,0);
      local_98.name = (StringPtr *)&f;
      _local_e8 = (WirePointer *)CONCAT44(uStack_e4,index);
      local_d0.update = &local_98;
      local_f8 = _f;
      local_98.this = this;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                ((Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                  *)&this->members,(Entry *)&local_f8,&local_d0);
      if (enumerant._reader.dataSize < 0x10) {
        if ((enumerants.reader.elementCount == 0) || (*__s != false)) {
LAB_00163be2:
          local_f8 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&enumerant);
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18],capnp::Text::Reader>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x1a2,FAILED,
                     "enumerant.getCodeOrder() < enumerants.size() && !sawCodeOrder[enumerant.getCodeOrder()]"
                     ,"\"invalid codeOrder\", enumerant.getName()",
                     (char (*) [18])"invalid codeOrder",(Reader *)&local_f8);
          this->isValid = false;
          kj::_::Debug::Fault::~Fault(&f);
          break;
        }
        uVar2 = 0;
      }
      else {
        uVar2 = (ulong)*enumerant._reader.data;
        if ((enumerants.reader.elementCount <= *enumerant._reader.data) || (__s[uVar2] != false))
        goto LAB_00163be2;
      }
      index = index + 1;
      __s[uVar2] = true;
    } while (LVar1 != index);
  }
  if (local_130 != (bool *)0x0) {
    (**(code **)*local_138)(local_138,local_130,1,local_140,local_140,0);
  }
  return;
}

Assistant:

KJ_STACK_ARRAY(bool, sawCodeOrder, enumerants.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto enumerant: enumerants) {
      validateMemberName(enumerant.getName(), index++);

      VALIDATE_SCHEMA(enumerant.getCodeOrder() < enumerants.size() &&
                      !sawCodeOrder[enumerant.getCodeOrder()],
                      "invalid codeOrder", enumerant.getName());
      sawCodeOrder[enumerant.getCodeOrder()] = true;
    }